

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShadingWriter.cpp
# Opt level: O2

EStatusCode __thiscall
FromTransparencyGroupWriter::OnFormXObjectWrite
          (FromTransparencyGroupWriter *this,ObjectIDType inFormXObjectID,
          ObjectIDType inFormXObjectResourcesDictionaryID,DictionaryContext *inFormDictionaryContext
          ,ObjectsContext *inPDFWriterObjectContext,DocumentContext *inDocumentContext)

{
  EStatusCode EVar1;
  DictionaryContext *this_00;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Group",&local_31);
  DictionaryContext::WriteKey(inFormDictionaryContext,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  this_00 = ObjectsContext::StartDictionary(inPDFWriterObjectContext);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Type",&local_31);
  DictionaryContext::WriteKey(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Group",&local_31);
  DictionaryContext::WriteNameValue(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"CS",&local_31);
  DictionaryContext::WriteKey(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"DeviceRGB",&local_31);
  DictionaryContext::WriteNameValue(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"S",&local_31);
  DictionaryContext::WriteKey(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Transparency",&local_31);
  DictionaryContext::WriteNameValue(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"I",&local_31);
  DictionaryContext::WriteKey(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  DictionaryContext::WriteBooleanValue(this_00,true);
  EVar1 = ObjectsContext::EndDictionary(inPDFWriterObjectContext,this_00);
  return EVar1;
}

Assistant:

virtual PDFHummus::EStatusCode OnFormXObjectWrite(
                        ObjectIDType inFormXObjectID,
                        ObjectIDType inFormXObjectResourcesDictionaryID,
                        DictionaryContext* inFormDictionaryContext,
                        ObjectsContext* inPDFWriterObjectContext,
                        PDFHummus::DocumentContext* inDocumentContext){
            inFormDictionaryContext->WriteKey("Group");
            DictionaryContext* transparencyGroup = inPDFWriterObjectContext->StartDictionary();
            transparencyGroup->WriteKey("Type");
            transparencyGroup->WriteNameValue("Group");
            transparencyGroup->WriteKey("CS");
            transparencyGroup->WriteNameValue("DeviceRGB");
            transparencyGroup->WriteKey("S");
            transparencyGroup->WriteNameValue("Transparency");
            transparencyGroup->WriteKey("I");
            transparencyGroup->WriteBooleanValue(true);
            return inPDFWriterObjectContext->EndDictionary(transparencyGroup);
        }